

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Annotation *a)

{
  bool bVar1;
  reference pPVar2;
  Expression *value;
  Property *property;
  iterator __end2;
  iterator __begin2;
  vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  *__range2;
  Annotation *a_local;
  PostResolutionChecks *this_local;
  
  ASTVisitor::visit(&this->super_ASTVisitor,a);
  __end2 = std::
           vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ::begin(&a->properties);
  property = (Property *)
             std::
             vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
             ::end(&a->properties);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
                                *)&property);
    if (!bVar1) break;
    pPVar2 = __gnu_cxx::
             __normal_iterator<soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
             ::operator*(&__end2);
    value = pool_ref::operator_cast_to_Expression_((pool_ref *)&pPVar2->value);
    checkPropertyValue(value);
    __gnu_cxx::
    __normal_iterator<soul::AST::Annotation::Property_*,_std::vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void visit (AST::Annotation& a) override
        {
            super::visit (a);

            for (auto& property : a.properties)
                checkPropertyValue (property.value);
        }